

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_test.cpp
# Opt level: O0

void __thiscall
CheckedMutexTest_InvalidUnlock1_Test<yamc::checked::timed_mutex>::TestBody
          (CheckedMutexTest_InvalidUnlock1_Test<yamc::checked::timed_mutex> *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_1d8;
  Message local_1d0 [2];
  system_error *anon_var_0;
  type e_2;
  undefined1 local_190 [7];
  bool gtest_caught_expected;
  TrueWithString gtest_msg_2;
  AssertHelper local_150;
  Message local_148 [6];
  exception *e_1;
  TrueWithString gtest_msg_1;
  AssertHelper local_d8;
  Message local_d0 [6];
  exception *e;
  undefined1 local_90 [8];
  TrueWithString gtest_msg;
  TypeParam mtx;
  CheckedMutexTest_InvalidUnlock1_Test<yamc::checked::timed_mutex> *this_local;
  
  yamc::checked::timed_mutex::timed_mutex((timed_mutex *)(gtest_msg.value.field_2._M_local_buf + 8))
  ;
  memset(local_90,0,0x20);
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)local_90);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)local_90);
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      yamc::checked::detail::mutex_base::lock((mutex_base *)((long)&gtest_msg.value.field_2 + 8));
    }
    e._0_4_ = 0;
  }
  else {
    testing::Message::Message(local_d0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&gtest_msg_1.value.field_2 + 8),
                   "Expected: mtx.lock() doesn\'t throw an exception.\n  Actual: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
               ,0x66,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d8,local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    std::__cxx11::string::~string((string *)(gtest_msg_1.value.field_2._M_local_buf + 8));
    testing::Message::~Message(local_d0);
    e._0_4_ = 1;
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)local_90);
  if ((int)e != 0) goto LAB_001e3b8b;
  memset(&e_1,0,0x20);
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)&e_1);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)&e_1);
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      yamc::checked::detail::mutex_base::unlock((mutex_base *)((long)&gtest_msg.value.field_2 + 8));
    }
    e._0_4_ = 0;
  }
  else {
    testing::Message::Message(local_148);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&gtest_msg_2.value.field_2 + 8),
                   "Expected: mtx.unlock() doesn\'t throw an exception.\n  Actual: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e_1);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
               ,0x67,pcVar2);
    testing::internal::AssertHelper::operator=(&local_150,local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    std::__cxx11::string::~string((string *)(gtest_msg_2.value.field_2._M_local_buf + 8));
    testing::Message::~Message(local_148);
    e._0_4_ = 1;
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)&e_1);
  if ((int)e != 0) goto LAB_001e3b8b;
  memset(local_190,0,0x20);
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)local_190);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)local_190);
  if (bVar1) {
    e_2._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      yamc::checked::detail::mutex_base::unlock((mutex_base *)((long)&gtest_msg.value.field_2 + 8));
    }
    if ((e_2._7_1_ & 1) == 0) {
      std::__cxx11::string::operator=
                ((string *)local_190,
                 "Expected: mtx.unlock() throws an exception of type std::system_error.\n  Actual: it throws nothing."
                );
      goto LAB_001e3aca;
    }
  }
  else {
LAB_001e3aca:
    testing::Message::Message(local_1d0);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
               ,0x68,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1d8,local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    testing::Message::~Message(local_1d0);
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)local_190);
  e._0_4_ = 0;
LAB_001e3b8b:
  yamc::checked::timed_mutex::~timed_mutex
            ((timed_mutex *)(gtest_msg.value.field_2._M_local_buf + 8));
  return;
}

Assistant:

TYPED_TEST(CheckedMutexTest, InvalidUnlock1) {
  TypeParam mtx;
  ASSERT_NO_THROW(mtx.lock());
  ASSERT_NO_THROW(mtx.unlock());
  EXPECT_CHECK_FAILURE(mtx.unlock());
}